

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O0

void If_Dec08Verify(word *pF,int nVars,uint *pZ)

{
  uint uVar1;
  int iVar2;
  uint z;
  int nWords;
  int k;
  int v;
  int w;
  int i;
  word *pG [4];
  word pN [16] [16];
  uint *pZ_local;
  int nVars_local;
  word *pF_local;
  
  iVar2 = If_Dec08WordNum(nVars);
  for (z = 0; (int)z < nVars; z = z + 1) {
    for (k = 0; k < iVar2; k = k + 1) {
      pN[(long)(int)z + -1][(long)k + 0xf] = Truth10[(int)z][k];
    }
  }
  for (v = 0; uVar1 = pZ[v], uVar1 != 0; v = v + 1) {
    for (nWords = 0; nWords < 4; nWords = nWords + 1) {
      *(word **)(&w + (long)nWords * 2) =
           pN[(ulong)(uVar1 >> ((char)(nWords << 2) + 0x10U & 0x1f) & 7) - 1] + 0xf;
    }
    If_Dec08ComposeLut4(uVar1 & 0xffff,(word **)&w,pN[(long)(int)z + -1] + 0xf,nVars);
    z = z + 1;
  }
  k = 0;
  while( true ) {
    if (iVar2 <= k) {
      return;
    }
    if (pN[(long)(int)(z - 1) + -1][(long)k + 0xf] != pF[k]) break;
    k = k + 1;
  }
  If_Dec08PrintConfig(pZ);
  Kit_DsdPrintFromTruth((uint *)pF,nVars);
  printf("\n");
  Kit_DsdPrintFromTruth((uint *)(pN[(long)(int)(z - 1) + -1] + 0xf),nVars);
  printf("\n");
  printf("Verification failed!\n");
  return;
}

Assistant:

void If_Dec08Verify( word * pF, int nVars, unsigned * pZ )
{
    word pN[16][16], * pG[4];
    int i, w, v, k, nWords;
    unsigned z;
    nWords = If_Dec08WordNum( nVars );
    for ( k = 0; k < nVars; k++ )
        for ( w = 0; w < nWords; w++ )
            pN[k][w] = Truth10[k][w];
    for ( i = 0; (z = pZ[i]); i++, k++ )
    {
        for ( v = 0; v < 4; v++ )
            pG[v] = pN[ (z >> (16+(v<<2))) & 7 ];
        If_Dec08ComposeLut4( (int)(z & 0xffff), pG, pN[k], nVars );
    }
    k--;
    for ( w = 0; w < nWords; w++ )
        if ( pN[k][w] != pF[w] )
        {
            If_Dec08PrintConfig( pZ );
            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned*)pN[k], nVars ); printf( "\n" );
            printf( "Verification failed!\n" );
            break;
        }
}